

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O3

void __thiscall OpenMD::MoleculeStamp::checkInversions(MoleculeStamp *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  _Head_base<0UL,_int,_false> _Var4;
  long lVar5;
  pointer piVar6;
  AtomStamp *pAVar7;
  pointer pcVar8;
  undefined1 auVar9 [8];
  bool bVar10;
  int __tmp;
  pointer ppBVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  _Tuple_impl<2UL,_int,_int> _Var14;
  pointer ppIVar15;
  iterator iVar16;
  _Base_ptr p_Var17;
  InversionStamp *pIVar18;
  pointer ppAVar19;
  ostream *poVar20;
  OpenMDException *pOVar21;
  int iVar22;
  pointer ppIVar23;
  pointer ppAVar24;
  _Head_base<3UL,_int,_false> _Var25;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  int *piVar26;
  ulong uVar27;
  _Alloc_hider _Var28;
  ulong uVar29;
  long lVar30;
  vector<int,_std::allocator<int>_> satellites;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allInversions;
  int b;
  tuple<int,_int,_int,_int> inversionTuple;
  vector<int,_std::allocator<int>_> inversion;
  ostringstream oss;
  undefined1 local_248 [8];
  _Tuple_impl<2UL,_int,_int> _Stack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [32];
  _Base_ptr local_208;
  size_t local_200;
  string local_1f8;
  key_type local_1d8;
  _Base_ptr local_1c8;
  vector<int,_std::allocator<int>_> local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppIVar15 = (this->inversionStamps_).
             super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppIVar23 = (this->inversionStamps_).
             super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar23 != ppIVar15) {
    uVar29 = 0;
    do {
      pIVar18 = ppIVar15[(int)uVar29];
      iVar2 = pIVar18->center_;
      local_248._0_4_ = (_Head_base<3UL,_int,_false>)0x0;
      local_248._4_4_ = 0;
      _Stack_240.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
           (_Head_base<3UL,_int,_false>)0;
      _Stack_240.super__Head_base<2UL,_int,_false>._M_head_impl = 0;
      local_238._M_allocated_capacity = 0;
      if ((long)(pIVar18->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pIVar18->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0xc) {
        ppBVar11 = (this->bondStamps_).
                   super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish == ppBVar11) {
LAB_001eaae5:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar8 = (this->Name).data_._M_dataplus._M_p;
          local_228._0_8_ = local_228 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_228._0_8_,local_228._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,": found wrong number",0x14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20," of bonds for inversion center ",0x1f);
          std::ostream::operator<<(poVar20,iVar2);
          if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
            operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
          }
          pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar21,(string *)local_228);
          __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        lVar30 = 0;
        uVar27 = 0;
        do {
          lVar5 = *(long *)((long)ppBVar11 + (lVar30 >> 0x1d));
          iVar3 = *(int *)(lVar5 + 0xa0);
          local_228._0_4_ = iVar3;
          iVar22 = *(int *)(lVar5 + 0xa4);
          local_1f8._M_dataplus._M_p._0_4_ = iVar22;
          if (iVar3 == iVar2) {
            if (_Stack_240 == (_Tuple_impl<2UL,_int,_int>)local_238._M_allocated_capacity) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_248,(iterator)_Stack_240,
                         (int *)&local_1f8);
            }
            else {
              *(int *)_Stack_240 = iVar22;
              _Stack_240 = (_Tuple_impl<2UL,_int,_int>)((long)_Stack_240 + 4);
            }
          }
          if ((int)local_1f8._M_dataplus._M_p == iVar2) {
            if (_Stack_240 == (_Tuple_impl<2UL,_int,_int>)local_238._M_allocated_capacity) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_248,(iterator)_Stack_240,
                         (int *)local_228);
            }
            else {
              *(undefined4 *)_Stack_240 = local_228._0_4_;
              _Stack_240 = (_Tuple_impl<2UL,_int,_int>)((long)_Stack_240 + 4);
            }
          }
          uVar27 = uVar27 + 1;
          ppBVar11 = (this->bondStamps_).
                     super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          lVar30 = lVar30 + 0x100000000;
        } while (uVar27 < (ulong)((long)(this->bondStamps_).
                                        super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11
                                 >> 3));
        auVar9 = local_248;
        _Var14 = _Stack_240;
        if ((long)_Stack_240 - (long)local_248 != 0xc) goto LAB_001eaae5;
        if ((_Tuple_impl<2UL,_int,_int>)local_248 != _Stack_240) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_248,_Stack_240,2);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (auVar9,_Var14);
        }
        InversionStamp::setSatellites(pIVar18,(vector<int,_std::allocator<int>_> *)local_248);
        if ((_Tuple_impl<2UL,_int,_int>)local_248 != (_Tuple_impl<2UL,_int,_int>)0x0) {
          operator_delete((void *)local_248,local_238._M_allocated_capacity - (long)local_248);
        }
      }
      uVar29 = uVar29 + 1;
      ppIVar15 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar23 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar29 < (ulong)((long)ppIVar23 - (long)ppIVar15 >> 3));
  }
  if (ppIVar23 != ppIVar15) {
    lVar30 = 0;
    uVar29 = 0;
    do {
      lVar5 = *(long *)((long)ppIVar15 + (lVar30 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f8,
                 (vector<int,_std::allocator<int>_> *)(lVar5 + 0xa0));
      local_228._0_4_ = *(undefined4 *)(lVar5 + 0x98);
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                ((vector<int,_std::allocator<int>_> *)&local_1f8,
                 (const_iterator)local_1f8._M_dataplus._M_p,(value_type_conflict1 *)local_228);
      local_228._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                         (local_1f8._M_dataplus._M_p,local_1f8._M_string_length,local_228);
      local_228._0_8_ = (pointer)0x0;
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                         (local_1f8._M_dataplus._M_p,local_1f8._M_string_length,local_228);
      if ((_Var12._M_current != (int *)local_1f8._M_string_length) ||
         (_Var13._M_current != (int *)local_1f8._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar8 = (this->Name).data_._M_dataplus._M_p;
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_228._0_8_,local_228._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,": atoms of inversion",0x14);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_248,(OpenMD *)&local_1f8,cont);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)local_248,(long)_Stack_240);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," have invalid indices\n",0x16);
        if (local_248 != (undefined1  [8])&local_238) {
          operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
        }
        pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar21,(string *)local_228);
        __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar10 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)&local_1f8);
      if (bVar10) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar8 = (this->Name).data_._M_dataplus._M_p;
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_228._0_8_,local_228._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," : atoms of inversion",0x15);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_248,(OpenMD *)&local_1f8,cont_00);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)local_248,(long)_Stack_240);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20," have duplicated indices\n",0x19);
        if (local_248 != (undefined1  [8])&local_238) {
          operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
        }
        pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar21,(string *)local_228);
        __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p);
      }
      uVar29 = uVar29 + 1;
      ppIVar15 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar23 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar30 = lVar30 + 0x100000000;
    } while (uVar29 < (ulong)((long)ppIVar23 - (long)ppIVar15 >> 3));
    if (ppIVar23 != ppIVar15) {
      uVar29 = 0;
      do {
        pIVar18 = ppIVar15[(int)uVar29];
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_248,&pIVar18->satellites_);
        if (_Stack_240 == (_Tuple_impl<2UL,_int,_int>)local_238._M_allocated_capacity) {
          local_228._0_4_ = pIVar18->center_;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_248,(iterator)_Stack_240,
                     (int *)local_228);
        }
        else {
          *(int *)_Stack_240 = pIVar18->center_;
          _Stack_240 = (_Tuple_impl<2UL,_int,_int>)((long)_Stack_240 + 4);
        }
        local_228._0_8_ = (ulong)(uint)local_228._4_4_ << 0x20;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_1f8,
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (value_type_conflict1 *)local_228,(allocator_type *)&local_1c0);
        if ((_Tuple_impl<2UL,_int,_int>)local_248 != _Stack_240) {
          piVar6 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          _Var14 = (_Tuple_impl<2UL,_int,_int>)local_248;
          do {
            iVar2 = piVar6[*(int *)_Var14];
            lVar30 = (long)iVar2;
            if ((-1 < lVar30) &&
               (iVar3 = *(int *)(local_1f8._M_dataplus._M_p + lVar30 * 4),
               *(int *)(local_1f8._M_dataplus._M_p + lVar30 * 4) = iVar3 + 1, 2 < iVar3)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Error in Molecule ",0x12);
              pcVar8 = (this->Name).data_._M_dataplus._M_p;
              local_228._0_8_ = local_228 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_228,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
              poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_228._0_8_,local_228._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20,": inversion centered on atom ",0x1d);
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,pIVar18->center_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar20," has four atoms that belong to same rigidbody ",0x2e);
              poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n",1);
              if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
                operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
              }
              pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              OpenMDException::OpenMDException(pOVar21,(string *)local_228);
              __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
            }
            _Var14 = (_Tuple_impl<2UL,_int,_int>)((long)_Var14 + 4);
          } while (_Var14 != _Stack_240);
        }
        if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p
                         );
        }
        if ((_Tuple_impl<2UL,_int,_int>)local_248 != (_Tuple_impl<2UL,_int,_int>)0x0) {
          operator_delete((void *)local_248,local_238._M_allocated_capacity - (long)local_248);
        }
        uVar29 = uVar29 + 1;
        ppIVar15 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppIVar23 = (this->inversionStamps_).
                   super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (uVar29 < (ulong)((long)ppIVar23 - (long)ppIVar15 >> 3));
      local_228._24_8_ = local_228 + 8;
      local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
      local_228._16_8_ = (_Base_ptr)0x0;
      local_200 = 0;
      local_208 = (_Base_ptr)local_228._24_8_;
      local_1c8 = (_Base_ptr)local_228._24_8_;
      if (ppIVar23 != ppIVar15) {
        lVar30 = 0;
        uVar29 = 0;
        do {
          lVar5 = *(long *)((long)ppIVar15 + (lVar30 >> 0x1d));
          iVar2 = *(int *)(lVar5 + 0x98);
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_1c0,(vector<int,_std::allocator<int>_> *)(lVar5 + 0xa0));
          _Var25._M_head_impl =
               local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[2];
          iVar3 = local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
          local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
          .super__Head_base<1UL,_int,_false>._M_head_impl =
               *local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
          iVar22 = iVar3;
          if (_Var25._M_head_impl < iVar3) {
            iVar22 = _Var25._M_head_impl;
            _Var25._M_head_impl = iVar3;
          }
          local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
          .super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = iVar22;
          if (iVar22 < local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                       super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                       _M_head_impl) {
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl =
                 local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>.
                 _M_head_impl;
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 iVar22;
          }
          local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
          .super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
          super__Head_base<3UL,_int,_false>._M_head_impl =
               (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)_Var25._M_head_impl;
          if (_Var25._M_head_impl <
              local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
              super__Head_base<2UL,_int,_false>._M_head_impl) {
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                 (_Head_base<3UL,_int,_false>)
                 (_Head_base<3UL,_int,_false>)
                 local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                 super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                 super__Head_base<2UL,_int,_false>;
            local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl = _Var25._M_head_impl;
          }
          local_1d8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl = iVar2;
          iVar16 = std::
                   _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                   ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                           *)local_228,&local_1d8);
          if (iVar16._M_node != (_Base_ptr)(local_228 + 8)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Molecule ",0x12);
            pcVar8 = (this->Name).data_._M_dataplus._M_p;
            local_248 = (undefined1  [8])&local_238;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_248,(long)_Stack_240);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,"Inversion",9);
            containerToString<std::vector<int,std::allocator<int>>>
                      (&local_1f8,(OpenMD *)&local_1c0,cont_01);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar20," appears multiple times\n",0x18);
            if (local_1f8._M_dataplus._M_p != (pointer)((long)&local_1f8 + 0x10)) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_248 != (undefined1  [8])&local_238) {
              operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
            }
            pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar21,(string *)local_248);
            __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          std::
          _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
          ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                    ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                      *)local_228,&local_1d8);
          if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (int *)0x0) {
            operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          uVar29 = uVar29 + 1;
          ppIVar15 = (this->inversionStamps_).
                     super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          lVar30 = lVar30 + 0x100000000;
        } while (uVar29 < (ulong)((long)(this->inversionStamps_).
                                        super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar15
                                 >> 3));
      }
      goto LAB_001ea7e9;
    }
  }
  local_228._24_8_ = local_228 + 8;
  local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
  local_228._16_8_ = (_Base_ptr)0x0;
  local_200 = 0;
  local_208 = (_Base_ptr)local_228._24_8_;
  local_1c8 = (_Base_ptr)local_228._24_8_;
LAB_001ea7e9:
  ppAVar19 = (this->atomStamps_).
             super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppAVar24 = (this->atomStamps_).
             super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppAVar24 != ppAVar19) {
    uVar29 = 0;
    do {
      pAVar7 = ppAVar19[(int)uVar29];
      if ((long)(pAVar7->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pAVar7->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 0xc) {
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_allocated_capacity = 0;
        p_Var17 = (pAVar7->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(pAVar7->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var17 == p_Var1) {
LAB_001ea8a4:
          _Var28._M_p = (pointer)0x0;
          piVar26 = (int *)0x0;
        }
        else {
          _Var25._M_head_impl = p_Var17[1]._M_color;
          local_248._0_4_ = _Var25._M_head_impl;
          if (_Var25._M_head_impl == -1) goto LAB_001ea8a4;
          do {
            if (local_1f8._M_string_length == local_1f8.field_2._M_allocated_capacity) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1f8,
                         (iterator)local_1f8._M_string_length,(int *)local_248);
            }
            else {
              *(int *)local_1f8._M_string_length = _Var25._M_head_impl;
              local_1f8._M_string_length = (size_type)(local_1f8._M_string_length + 4);
            }
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
            if ((_Rb_tree_header *)p_Var17 == p_Var1) break;
            _Var25._M_head_impl = p_Var17[1]._M_color;
            local_248._0_4_ = _Var25._M_head_impl;
          } while (_Var25._M_head_impl != -1);
          piVar26 = (int *)local_1f8._M_string_length;
          _Var28._M_p = local_1f8._M_dataplus._M_p;
        }
        if ((long)piVar26 - (long)_Var28._M_p != 0xc) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar8 = (this->Name).data_._M_dataplus._M_p;
          local_248 = (undefined1  [8])&local_238;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248,(long)_Stack_240);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,": found bond mismatch",0x15);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20," when detecting inversion centers.",0x22);
          if (local_248 != (undefined1  [8])&local_238) {
            operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
          }
          pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar21,(string *)local_248);
          __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        _Var4._M_head_impl = pAVar7->index_;
        if ((int *)_Var28._M_p != piVar26) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (_Var28._M_p,piVar26,2);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (_Var28._M_p,piVar26);
          _Var28._M_p = local_1f8._M_dataplus._M_p;
        }
        local_248._4_4_ = (int)*(undefined8 *)((long)_Var28._M_p + 4);
        local_248._0_4_ = (int)(int)((ulong)*(undefined8 *)((long)_Var28._M_p + 4) >> 0x20);
        _Stack_240.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)*(int *)_Var28._M_p;
        _Stack_240.super__Head_base<2UL,_int,_false>._M_head_impl = _Var4._M_head_impl;
        iVar16 = std::
                 _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                         *)local_228,(key_type *)local_248);
        if (iVar16._M_node == local_1c8) {
          std::
          _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
          ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                    ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                      *)local_228,(tuple<int,_int,_int,_int> *)local_248);
          pIVar18 = (InversionStamp *)operator_new(0xf8);
          InversionStamp::InversionStamp(pIVar18);
          pIVar18->center_ = _Var4._M_head_impl;
          InversionStamp::setSatellites(pIVar18,(vector<int,_std::allocator<int>_> *)&local_1f8);
          addInversionStamp(this,pIVar18);
        }
        if ((pointer)local_1f8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_1f8._M_dataplus._M_p,
                          local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p
                         );
        }
        ppAVar19 = (this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppAVar24 = (this->atomStamps_).
                   super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < (ulong)((long)ppAVar24 - (long)ppAVar19 >> 3));
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               *)local_228);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkInversions() {
    std::ostringstream oss;

    // first we automatically find the other three atoms that
    // are satellites of an inversion center:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int center                     = inversionStamp->getCenter();
      std::vector<int> satellites;

      // Some inversions come pre-programmed with the satellites.  If
      // so, don't add the satellites as they are already there.

      if (inversionStamp->getNSatellites() != 3) {
        for (std::size_t j = 0; j < getNBonds(); ++j) {
          BondStamp* bondStamp = getBondStamp(j);
          int a                = bondStamp->getA();
          int b                = bondStamp->getB();

          if (a == center) { satellites.push_back(b); }
          if (b == center) { satellites.push_back(a); }
        }

        if (satellites.size() == 3) {
          std::sort(satellites.begin(), satellites.end());
          inversionStamp->setSatellites(satellites);
        } else {
          oss << "Error in Molecule " << getName() << ": found wrong number"
              << " of bonds for inversion center " << center;
          throw OpenMDException(oss.str());
        }
      }
    }

    // then we do some sanity checking on the inversions:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);

      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      // add the central atom to the beginning of the list:
      inversionAtoms.insert(inversionAtoms.begin(),
                            inversionStamp->getCenter());

      std::vector<int>::iterator j =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != inversionAtoms.end() || k != inversionAtoms.end()) {
        oss << "Error in Molecule " << getName() << ": atoms of inversion"
            << containerToString(inversionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(inversionAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of inversion"
            << containerToString(inversionAtoms)
            << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp  = getInversionStamp(i);
      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      inversionAtoms.push_back(inversionStamp->getCenter());
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = inversionAtoms.begin(); j != inversionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Molecule " << getName()
                << ": inversion centered on atom "
                << inversionStamp->getCenter()
                << " has four atoms that belong to same rigidbody "
                << rigidbodyIndex << "\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allInversions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int cent                       = inversionStamp->getCenter();
      std::vector<int> inversion     = inversionStamp->getSatellites();

      std::tuple<int, int, int, int> inversionTuple {
          cent, inversion[0], inversion[1], inversion[2]};
      auto& [first, second, third, fourth] = inversionTuple;

      // In OpenMD, the Central atom in an inversion comes first, and
      // has a special position.  The other three atoms can come in
      // random order, and should be sorted in increasing numerical
      // order to check for duplicates.  This requires three pairwise
      // swaps:
      if (third > fourth) std::swap(third, fourth);
      if (second > third) std::swap(second, third);
      if (third > fourth) std::swap(third, fourth);

      iter = allInversions.find(inversionTuple);
      if (iter == allInversions.end()) {
        allInversions.insert(inversionTuple);
      } else {
        oss << "Error in Molecule " << getName() << ": "
            << "Inversion" << containerToString(inversion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }

    // Next we automatically find the inversion centers that weren't
    // explicitly created.  An inversion center is any atom that has
    // exactly three bonds to it.  Not all inversion centers have
    // potentials associated with them.

    for (std::size_t i = 0; i < getNAtoms(); ++i) {
      AtomStamp* ai = getAtomStamp(i);
      if (ai->getCoordination() == 3) {
        AtomStamp::AtomIter ai2;
        std::vector<int> satellites;
        for (int a = ai->getFirstBondedAtom(ai2); a != -1;
             a     = ai->getNextBondedAtom(ai2)) {
          satellites.push_back(a);
        }
        if (satellites.size() == 3) {
          int cent = ai->getIndex();
          std::sort(satellites.begin(), satellites.end());

          std::tuple<int, int, int, int> newInversion {
              cent, satellites[0], satellites[1], satellites[2]};
          auto [first, second, third, fourth] = newInversion;

          if (third > fourth) std::swap(third, fourth);
          if (second > third) std::swap(second, third);
          if (third > fourth) std::swap(third, fourth);

          if (allInversions.find(newInversion) == allInversions.end()) {
            allInversions.insert(newInversion);
            InversionStamp* newInversionStamp = new InversionStamp();
            newInversionStamp->setCenter(cent);
            newInversionStamp->setSatellites(satellites);
            addInversionStamp(newInversionStamp);
          }

        } else {
          oss << "Error in Molecule " << getName() << ": found bond mismatch"
              << " when detecting inversion centers.";
          throw OpenMDException(oss.str());
        }
      }
    }
  }